

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall
helics::CommsInterface::loadTargetInfo
          (CommsInterface *this,string_view localTarget,string_view brokerTarget,
          InterfaceNetworks targetNetwork)

{
  bool bVar1;
  CommsInterface *in_RDI;
  InterfaceNetworks in_R9B;
  undefined7 in_stack_ffffffffffffffd0;
  
  bVar1 = propertyLock(in_RDI);
  if (bVar1) {
    std::__cxx11::string::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_R9B,in_stack_ffffffffffffffd0),
               (basic_string_view<char,_std::char_traits<char>_> *)in_RDI);
    std::__cxx11::string::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_R9B,in_stack_ffffffffffffffd0),
               (basic_string_view<char,_std::char_traits<char>_> *)in_RDI);
    in_RDI->interfaceNetwork = in_R9B;
    propertyUnLock((CommsInterface *)CONCAT17(in_R9B,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void CommsInterface::loadTargetInfo(std::string_view localTarget,
                                    std::string_view brokerTarget,
                                    gmlc::networking::InterfaceNetworks targetNetwork)
{
    if (propertyLock()) {
        localTargetAddress = localTarget;
        brokerTargetAddress = brokerTarget;
        interfaceNetwork = targetNetwork;
        propertyUnLock();
    }
}